

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashid.h
# Opt level: O0

int hashid_insert(hashid *hi,int id)

{
  uint uVar1;
  int iVar2;
  int h;
  int index;
  int i;
  hashid_node *c;
  int id_local;
  hashid *hi_local;
  
  _index = (hashid_node *)0x0;
  h = 0;
  do {
    if (hi->cap <= h) {
LAB_0010fe09:
      if (_index == (hashid_node *)0x0) {
        __assert_fail("c",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/hashid.h"
                      ,0x66,"int hashid_insert(struct hashid *, int)");
      }
      hi->count = hi->count + 1;
      _index->id = id;
      if (_index->next == (hashid_node *)0x0) {
        uVar1 = id & hi->hashmod;
        if (hi->hash[(int)uVar1] != (hashid_node *)0x0) {
          _index->next = hi->hash[(int)uVar1];
        }
        hi->hash[(int)uVar1] = _index;
        return (int)((long)_index - (long)hi->id >> 4);
      }
      __assert_fail("c->next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/hashid.h"
                    ,0x69,"int hashid_insert(struct hashid *, int)");
    }
    iVar2 = (h + id) % hi->cap;
    if (hi->id[iVar2].id == -1) {
      _index = hi->id + iVar2;
      goto LAB_0010fe09;
    }
    h = h + 1;
  } while( true );
}

Assistant:

static int
hashid_insert(struct hashid * hi, int id) {
	struct hashid_node *c = NULL;
	int i;
	for (i=0;i<hi->cap;i++) {
		int index = (i+id) % hi->cap;
		if (hi->id[index].id == -1) {
			c = &hi->id[index];
			break;
		}
	}
	assert(c);
	++hi->count;
	c->id = id;
	assert(c->next == NULL);
	int h = id & hi->hashmod;
	if (hi->hash[h]) {
		c->next = hi->hash[h];
	}
	hi->hash[h] = c;
	
	return c - hi->id;
}